

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynastyDeck.cpp
# Opt level: O0

void __thiscall
DynastyDeck::BattleConsequences(DynastyDeck *this,bool attacker,bool won,int ap,int dp)

{
  Item *pIVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  reference ppBVar5;
  _Self local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  _Self local_78;
  _List_node_base *local_70;
  _List_node_base *local_68;
  _Self local_60;
  _List_node_base *local_58;
  _List_node_base *local_50;
  _Self local_48;
  _List_node_base *local_40;
  Item *local_38;
  Item *item;
  Personality *pers;
  iterator it;
  int dp_local;
  int ap_local;
  bool won_local;
  bool attacker_local;
  DynastyDeck *this_local;
  
  it._M_node._4_4_ = dp;
  std::_List_iterator<BlackCard_*>::_List_iterator((_List_iterator<BlackCard_*> *)&pers);
  item = (Item *)0x0;
  local_38 = (Item *)0x0;
  if (won) {
    if (attacker) {
      local_40 = (_List_node_base *)
                 std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin
                           (&this->dynDeck);
      pers = (Personality *)local_40;
      while( true ) {
        local_48._M_node =
             (_List_node_base *)
             std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end(&this->dynDeck);
        bVar2 = std::operator!=((_Self *)&pers,&local_48);
        if (!bVar2) break;
        ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
        bVar2 = BlackCard::isTapped(*ppBVar5);
        if (!bVar2) {
          ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                              ((_List_iterator<BlackCard_*> *)&pers);
          item = (Item *)*ppBVar5;
          iVar3 = Personality::getAttack((Personality *)item);
          if (iVar3 < ap - it._M_node._4_4_) {
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            BlackCard::setTapped(*ppBVar5,true);
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            TVar4 = Card::getType(&(*ppBVar5)->super_Card);
            if (TVar4 == PERSONALITY) {
              ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                  ((_List_iterator<BlackCard_*> *)&pers);
              item = (Item *)*ppBVar5;
              Personality::PersonalityConsequences((Personality *)item);
            }
            else {
              ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                  ((_List_iterator<BlackCard_*> *)&pers);
              BlackCard::setTapped(*ppBVar5,true);
              ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                  ((_List_iterator<BlackCard_*> *)&pers);
              TVar4 = Card::getType(&(*ppBVar5)->super_Card);
              if (TVar4 == PERSONALITY) {
                ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                    ((_List_iterator<BlackCard_*> *)&pers);
                item = (Item *)*ppBVar5;
                Personality::PersonalityConsequences((Personality *)item);
              }
              else {
                ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                    ((_List_iterator<BlackCard_*> *)&pers);
                pIVar1 = (Item *)*ppBVar5;
                local_38 = pIVar1;
                iVar3 = Item::getDurability(pIVar1);
                Item::setDurability(pIVar1,iVar3 + -1);
              }
            }
          }
          else {
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            popCard(this,*ppBVar5);
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            if (*ppBVar5 != (BlackCard *)0x0) {
              (*((*ppBVar5)->super_Card)._vptr_Card[3])();
            }
          }
        }
        local_50 = (_List_node_base *)
                   std::_List_iterator<BlackCard_*>::operator++
                             ((_List_iterator<BlackCard_*> *)&pers,0);
      }
    }
    else {
      local_58 = (_List_node_base *)
                 std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin
                           (&this->dynDeck);
      pers = (Personality *)local_58;
      while( true ) {
        local_60._M_node =
             (_List_node_base *)
             std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end(&this->dynDeck);
        bVar2 = std::operator!=((_Self *)&pers,&local_60);
        if (!bVar2) break;
        ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
        bVar2 = BlackCard::isTapped(*ppBVar5);
        if (!bVar2) {
          ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                              ((_List_iterator<BlackCard_*> *)&pers);
          item = (Item *)*ppBVar5;
          iVar3 = Personality::getAttack((Personality *)item);
          if (iVar3 < ap - it._M_node._4_4_) {
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            BlackCard::setTapped(*ppBVar5,true);
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            TVar4 = Card::getType(&(*ppBVar5)->super_Card);
            if (TVar4 == PERSONALITY) {
              ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                  ((_List_iterator<BlackCard_*> *)&pers);
              item = (Item *)*ppBVar5;
              Personality::PersonalityConsequences((Personality *)item);
            }
            else {
              ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                  ((_List_iterator<BlackCard_*> *)&pers);
              pIVar1 = (Item *)*ppBVar5;
              local_38 = pIVar1;
              iVar3 = Item::getDurability(pIVar1);
              Item::setDurability(pIVar1,iVar3 + -1);
            }
          }
          else {
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            popCard(this,*ppBVar5);
            ppBVar5 = std::_List_iterator<BlackCard_*>::operator*
                                ((_List_iterator<BlackCard_*> *)&pers);
            if (*ppBVar5 != (BlackCard *)0x0) {
              (*((*ppBVar5)->super_Card)._vptr_Card[3])();
            }
          }
        }
        local_68 = (_List_node_base *)
                   std::_List_iterator<BlackCard_*>::operator++
                             ((_List_iterator<BlackCard_*> *)&pers,0);
      }
    }
  }
  else if (attacker) {
    local_70 = (_List_node_base *)
               std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(&this->dynDeck);
    pers = (Personality *)local_70;
    while( true ) {
      local_78._M_node =
           (_List_node_base *)
           std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end(&this->dynDeck);
      bVar2 = std::operator!=((_Self *)&pers,&local_78);
      if (!bVar2) break;
      ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
      bVar2 = BlackCard::isTapped(*ppBVar5);
      if (!bVar2) {
        ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
        popCard(this,*ppBVar5);
        ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
        if (*ppBVar5 != (BlackCard *)0x0) {
          (*((*ppBVar5)->super_Card)._vptr_Card[3])();
        }
      }
      local_80 = (_List_node_base *)
                 std::_List_iterator<BlackCard_*>::operator++
                           ((_List_iterator<BlackCard_*> *)&pers,0);
    }
  }
  else {
    local_88 = (_List_node_base *)
               std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(&this->dynDeck);
    pers = (Personality *)local_88;
    while( true ) {
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end(&this->dynDeck);
      bVar2 = std::operator!=((_Self *)&pers,&local_90);
      if (!bVar2) break;
      ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
      bVar2 = BlackCard::isTapped(*ppBVar5);
      if (bVar2) {
        ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
        popCard(this,*ppBVar5);
        ppBVar5 = std::_List_iterator<BlackCard_*>::operator*((_List_iterator<BlackCard_*> *)&pers);
        if (*ppBVar5 != (BlackCard *)0x0) {
          (*((*ppBVar5)->super_Card)._vptr_Card[3])();
        }
      }
      std::_List_iterator<BlackCard_*>::operator++((_List_iterator<BlackCard_*> *)&pers,0);
    }
  }
  if (item != (Item *)0x0) {
    (*(item->super_GreenCard).super_Card._vptr_Card[3])();
  }
  if (local_38 != (Item *)0x0) {
    (*(local_38->super_GreenCard).super_Card._vptr_Card[3])();
  }
  return;
}

Assistant:

void DynastyDeck::BattleConsequences(bool attacker, bool won, int ap, int dp)                 //changes armies of player according to battle state
{
    list <BlackCard*>::iterator it;
    Personality* pers = nullptr;
    Item* item = nullptr;

    if (won)
    {
        if (attacker)
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                pers = reinterpret_cast<Personality*>(*it);
                if (pers->getAttack() >= ap - dp)
                {
                    popCard(*it);
                    delete *it;
                }
                else
                {
                    (*it)->setTapped(true);

                    if ((*it)->getType() == Card::PERSONALITY)
                    {
                        pers = reinterpret_cast<Personality*>(*it);
                        pers->PersonalityConsequences();
                    }
                    else
                    {
                        (*it)->setTapped(true);

                        if ((*it)->getType() == Card::PERSONALITY)
                        {
                            pers = reinterpret_cast<Personality*>(*it);
                            pers->PersonalityConsequences();
                        }
                        else
                        {
                            item = reinterpret_cast<Item*>(*it);
                            item->setDurability(item->getDurability() - 1);
                        }
                    }
                }
            }
        }
        else
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                pers = reinterpret_cast<Personality*>(*it);
                if (pers->getAttack() >= ap - dp)
                {
                    popCard(*it);
                    delete *it;
                }
                else
                {
                    (*it)->setTapped(true);

                    if ((*it)->getType() == Card::PERSONALITY)
                    {
                        pers = reinterpret_cast<Personality*>(*it);
                        pers->PersonalityConsequences();
                    }
                    else
                    {
                        item = reinterpret_cast<Item*>(*it);
                        item->setDurability(item->getDurability() - 1);
                    }
                }
            }
        }
    }
    else
    {
        if (attacker)
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                popCard(*it);
                delete *it;
            }
        }
        else
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if (!(*it)->isTapped())
                    continue;

                popCard(*it);
                delete *it;
            }
        }
    }
    delete pers;
    delete item;
}